

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebuggerPosixPipeConnection.cxx
# Opt level: O3

void __thiscall
cmDebugger::cmDebuggerPipeConnection_POSIX::write(cmDebuggerPipeConnection_POSIX *this)

{
  int __fd;
  ssize_t sVar1;
  size_t in_RDX;
  void *in_RSI;
  
  __fd = *(int *)((this->addr).sun_path + 0x6a);
  if ((-1 < __fd) && (sVar1 = ::write(__fd,in_RSI,in_RDX), sVar1 < 0)) {
    (**(code **)(*(long *)&this[-1].listen_fd + 0x18))(&this[-1].listen_fd);
  }
  return;
}

Assistant:

bool cmDebuggerPipeConnection_POSIX::write(void const* buffer, size_t n)
{
  bool result = false;
  if (rw_pipe >= 0) {
    result = ::write(rw_pipe, buffer, n) >= 0;
    if (!result) {
      close();
    }
  }

  return result;
}